

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_frequency_transform.cc
# Opt level: O3

void __thiscall
sptk::SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform
          (SecondOrderAllPassFrequencyTransform *this,int num_input_order,int num_output_order,
          int fft_length,double alpha,double theta)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  pointer pdVar3;
  long lVar4;
  pointer pvVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_type __n;
  ulong uVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  InverseFastFourierTransform inverse_fourier_transform;
  vector<double,_std::allocator<double>_> ww;
  vector<double,_std::allocator<double>_> dw;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  InverseFastFourierTransform local_148;
  vector<double,_std::allocator<double>_> local_110;
  vector<double,_std::allocator<double>_> local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_e0;
  double local_c8;
  double local_b8;
  long local_a0;
  double local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  this->_vptr_SecondOrderAllPassFrequencyTransform =
       (_func_int **)&PTR__SecondOrderAllPassFrequencyTransform_0011a748;
  this->num_input_order_ = num_input_order;
  this->num_output_order_ = num_output_order;
  this->alpha_ = alpha;
  this->theta_ = theta;
  this->is_valid_ = true;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conversion_matrix_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (num_input_order < fft_length && -1 < (num_output_order | num_input_order)) {
    this_00 = &this->conversion_matrix_;
    local_c8 = alpha;
    bVar6 = IsValidAlpha(alpha);
    if ((bVar6) && (bVar6 = IsInRange(this->theta_,0.0,3.141592653589793), bVar6)) {
      iVar1 = this->num_input_order_;
      iVar2 = this->num_output_order_;
      uVar12 = (ulong)(uint)fft_length;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_148,uVar12,
                 (allocator_type *)&local_90);
      __n = (long)iVar2 + 1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_e0,__n,(value_type *)&local_148,(allocator_type *)&local_110);
      if (local_148._vptr_InverseFastFourierTransform != (_func_int **)0x0) {
        operator_delete(local_148._vptr_InverseFastFourierTransform);
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_148,uVar12,
                 (allocator_type *)&local_110);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_90,__n,(value_type *)&local_148,(allocator_type *)&local_f8);
      if (local_148._vptr_InverseFastFourierTransform != (_func_int **)0x0) {
        operator_delete(local_148._vptr_InverseFastFourierTransform);
      }
      std::vector<double,_std::allocator<double>_>::vector
                (&local_110,uVar12,(allocator_type *)&local_148);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_f8,uVar12,(allocator_type *)&local_148);
      local_a0 = (long)iVar1;
      if (0 < fft_length) {
        local_98 = 6.283185307179586 / (double)fft_length;
        local_58 = local_c8 * local_c8;
        local_68._8_4_ = SUB84(local_c8,0);
        local_68._0_8_ = local_c8;
        local_68._12_4_ = (int)((ulong)local_c8 >> 0x20);
        local_78 = -local_58;
        dStack_70 = -local_58;
        local_48 = -(local_c8 + local_c8);
        dStack_40 = -(local_c8 + local_c8);
        uVar14 = 0;
        dStack_50 = local_58;
        do {
          dVar15 = (double)(int)uVar14 * local_98;
          dVar16 = Warp(dVar15,local_c8,theta);
          local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] = dVar16;
          local_b8 = cos(dVar15 - theta);
          dVar15 = cos(dVar15 + theta);
          auVar17._0_8_ = (double)local_68._0_8_ * local_b8 + local_78;
          auVar17._8_8_ = (double)local_68._8_8_ * dVar15 + dStack_70;
          dVar15 = dVar15 * dStack_40 + 1.0 + dStack_50;
          auVar18._8_4_ = SUB84(dVar15,0);
          auVar18._0_8_ = local_b8 * local_48 + 1.0 + local_58;
          auVar18._12_4_ = (int)((ulong)dVar15 >> 0x20);
          auVar18 = divpd(auVar17,auVar18);
          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] = auVar18._8_8_ + auVar18._0_8_ + 1.0;
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      local_b8 = (double)__n;
      InverseFastFourierTransform::InverseFastFourierTransform(&local_148,fft_length);
      if (-1 < this->num_output_order_) {
        lVar10 = 0;
        do {
          if (0 < fft_length) {
            uVar14 = 0;
            do {
              dVar15 = cos(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14] * (double)(int)lVar10);
              local_e0.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar10].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar14] =
                   dVar15 * local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar14];
              dVar15 = sin(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14] * (double)(int)lVar10);
              local_90.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar10].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar14] =
                   -dVar15 * local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar12 != uVar14);
          }
          bVar6 = InverseFastFourierTransform::Run
                            (&local_148,
                             local_e0.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10,
                             local_90.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10);
          if (!bVar6) {
            this->is_valid_ = false;
            local_148._vptr_InverseFastFourierTransform =
                 (_func_int **)&PTR__InverseFastFourierTransform_0011a868;
            local_148.fast_fourier_transform_._vptr_FastFourierTransform =
                 (_func_int **)&PTR__FastFourierTransform_0011a7d8;
            if (local_148.fast_fourier_transform_.sine_table_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              operator_delete(local_148.fast_fourier_transform_.sine_table_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            goto LAB_0010b009;
          }
          uVar8 = this->num_input_order_;
          if (0 < (int)uVar8) {
            pdVar3 = local_e0.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar10].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar9 = pdVar3 + (long)fft_length + -1;
            lVar11 = 1;
            do {
              pdVar3[lVar11] = *pdVar9 + pdVar3[lVar11];
              lVar11 = lVar11 + 1;
              pdVar9 = pdVar9 + -1;
            } while ((ulong)uVar8 + 1 != lVar11);
          }
          bVar6 = lVar10 < this->num_output_order_;
          lVar10 = lVar10 + 1;
        } while (bVar6);
      }
      local_148._vptr_InverseFastFourierTransform =
           (_func_int **)&PTR__InverseFastFourierTransform_0011a868;
      local_148.fast_fourier_transform_._vptr_FastFourierTransform =
           (_func_int **)&PTR__FastFourierTransform_0011a7d8;
      if (local_148.fast_fourier_transform_.sine_table_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_148.fast_fourier_transform_.sine_table_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar10 = local_a0;
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_00,(size_type)local_b8);
      uVar8 = this->num_output_order_;
      if ((int)uVar8 < 0) {
        uVar7 = this->num_input_order_;
      }
      else {
        lVar11 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((this_00->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar11,lVar10 + 1);
          uVar7 = this->num_input_order_;
          if (-1 < (int)uVar7) {
            pdVar3 = local_e0.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar11].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar4 = *(long *)&(this_00->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar11].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            lVar13 = 0;
            do {
              *(double *)(lVar4 + lVar13 * 8) = pdVar3[lVar13];
              lVar13 = lVar13 + 1;
            } while ((ulong)uVar7 + 1 != lVar13);
          }
          uVar8 = this->num_output_order_;
          bVar6 = lVar11 < (int)uVar8;
          lVar11 = lVar11 + 1;
        } while (bVar6);
      }
      if (0 < (int)uVar7) {
        lVar10 = *(long *)&(((this_00->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data;
        uVar12 = 1;
        do {
          *(double *)(lVar10 + uVar12 * 8) = *(double *)(lVar10 + uVar12 * 8) * 0.5;
          uVar12 = uVar12 + 1;
        } while (uVar7 + 1 != uVar12);
      }
      if (0 < (int)uVar8) {
        pvVar5 = (this_00->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = 0x18;
        do {
          pdVar9 = *(double **)
                    ((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar10);
          dVar15 = *pdVar9;
          *pdVar9 = dVar15 + dVar15;
          lVar10 = lVar10 + 0x18;
        } while ((ulong)uVar8 * 0x18 + 0x18 != lVar10);
      }
LAB_0010b009:
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_90);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_e0);
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

SecondOrderAllPassFrequencyTransform::SecondOrderAllPassFrequencyTransform(
    int num_input_order, int num_output_order, int fft_length, double alpha,
    double theta)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      alpha_(alpha),
      theta_(theta),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      fft_length <= num_input_order_ || !sptk::IsValidAlpha(alpha_) ||
      !sptk::IsInRange(theta_, 0.0, sptk::kPi)) {
    is_valid_ = false;
    return;
  }

  const int input_length(num_input_order_ + 1);
  const int output_length(num_output_order_ + 1);
  std::vector<std::vector<double> > real(output_length,
                                         std::vector<double>(fft_length));
  std::vector<std::vector<double> > imag(output_length,
                                         std::vector<double>(fft_length));
  {
    std::vector<double> ww(fft_length);
    std::vector<double> dw(fft_length);
    {
      const double delta(sptk::kTwoPi / fft_length);
      for (int j(0); j < fft_length; ++j) {
        const double omega(delta * j);
        ww[j] = sptk::Warp(omega, alpha, theta);
        dw[j] = DiffWarp(omega, alpha, theta);
      }
    }

    sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
    for (int m(0); m <= num_output_order_; ++m) {
      for (int j(0); j < fft_length; ++j) {
        real[m][j] = std::cos(ww[j] * m) * dw[j];
        imag[m][j] = -std::sin(ww[j] * m) * dw[j];
      }

      if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
        is_valid_ = false;
        return;
      }

      for (int j(1); j <= num_input_order_; ++j) {
        real[m][j] += real[m][fft_length - j];
      }
    }
  }

  conversion_matrix_.resize(output_length);
  for (int m2(0); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2].resize(input_length);
    for (int m1(0); m1 <= num_input_order_; ++m1) {
      conversion_matrix_[m2][m1] = real[m2][m1];
    }
  }
  for (int m1(1); m1 <= num_input_order_; ++m1) {
    conversion_matrix_[0][m1] *= 0.5;
  }
  for (int m2(1); m2 <= num_output_order_; ++m2) {
    conversion_matrix_[m2][0] *= 2.0;
  }
}